

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

void __thiscall
rapidjson::internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::Resize
          (Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *this,size_t newCapacity)

{
  char *pcVar1;
  char *originalPtr;
  char *pcVar2;
  
  pcVar1 = this->stackTop_;
  originalPtr = this->stack_;
  pcVar2 = (char *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                             (this->allocator_,originalPtr,(long)this->stackEnd_ - (long)originalPtr
                              ,newCapacity);
  this->stack_ = pcVar2;
  this->stackTop_ = pcVar2 + ((long)pcVar1 - (long)originalPtr);
  this->stackEnd_ = pcVar2 + newCapacity;
  return;
}

Assistant:

void Resize(size_t newCapacity) {
        const size_t size = GetSize();  // Backup the current size
        stack_ = static_cast<char*>(allocator_->Realloc(stack_, GetCapacity(), newCapacity));
        stackTop_ = stack_ + size;
        stackEnd_ = stack_ + newCapacity;
    }